

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86.cpp
# Opt level: O3

int __thiscall ncnn::Cast_x86::forward(Cast_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  int iVar2;
  int _h;
  int _d;
  int iVar3;
  int _elempack;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  undefined1 auVar8 [12];
  unsigned_short uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  void *pvVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  void *pvVar17;
  undefined1 (*pauVar18) [16];
  undefined8 *puVar19;
  undefined4 *puVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  iVar11 = (this->super_Cast).type_from;
  iVar10 = (this->super_Cast).type_to;
  if (iVar11 == iVar10) {
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar11 = bottom_blob->w;
      iVar10 = bottom_blob->h;
      iVar2 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar11;
      top_blob->h = iVar10;
      top_blob->d = iVar2;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  iVar2 = bottom_blob->w;
  _h = bottom_blob->h;
  _d = bottom_blob->d;
  uVar12 = bottom_blob->c;
  iVar3 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar22 = (size_t)_elempack;
  switch(iVar10) {
  case 1:
    if (iVar11 == 3) {
      Cast::forward(&this->super_Cast,bottom_blob,top_blob,opt);
    }
    sVar22 = sVar22 * 4;
    break;
  case 2:
  case 4:
    sVar22 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar22 = bottom_blob->elemsize;
  }
  switch(iVar3) {
  case 1:
    Mat::create(top_blob,iVar2,sVar22,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar2,_h,sVar22,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar2,_h,uVar12,sVar22,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar2,_h,_d,uVar12,sVar22,_elempack,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  iVar11 = (this->super_Cast).type_from;
  iVar10 = (this->super_Cast).type_to;
  if (iVar10 == 2 && iVar11 == 1) {
    iVar11 = bottom_blob->c;
    if ((long)iVar11 < 1) {
      return 0;
    }
    iVar10 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar16 = 0;
    do {
      if (0 < iVar10) {
        sVar22 = top_blob->cstep;
        sVar5 = bottom_blob->cstep;
        sVar6 = top_blob->elemsize;
        pvVar13 = top_blob->data;
        sVar7 = bottom_blob->elemsize;
        pvVar17 = bottom_blob->data;
        lVar14 = 0;
        do {
          uVar9 = float32_to_float16(*(float *)((long)pvVar17 + lVar14 * 4 + sVar5 * sVar7 * lVar16)
                                    );
          *(unsigned_short *)((long)pvVar13 + lVar14 * 2 + sVar22 * sVar6 * lVar16) = uVar9;
          lVar14 = lVar14 + 1;
        } while (iVar10 != (int)lVar14);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != iVar11);
    iVar11 = (this->super_Cast).type_from;
    iVar10 = (this->super_Cast).type_to;
  }
  if (iVar10 == 1 && iVar11 == 2) {
    iVar11 = bottom_blob->c;
    if ((long)iVar11 < 1) {
      return 0;
    }
    iVar10 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar16 = 0;
    do {
      if (0 < iVar10) {
        sVar22 = top_blob->cstep;
        sVar5 = bottom_blob->cstep;
        sVar6 = top_blob->elemsize;
        pvVar13 = top_blob->data;
        sVar7 = bottom_blob->elemsize;
        pvVar17 = bottom_blob->data;
        lVar14 = 0;
        do {
          fVar24 = float16_to_float32(*(unsigned_short *)
                                       ((long)pvVar17 + lVar14 * 2 + sVar5 * sVar7 * lVar16));
          *(float *)((long)pvVar13 + lVar14 * 4 + sVar22 * sVar6 * lVar16) = fVar24;
          lVar14 = lVar14 + 1;
        } while (iVar10 != (int)lVar14);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != iVar11);
    iVar11 = (this->super_Cast).type_from;
    iVar10 = (this->super_Cast).type_to;
  }
  if (0 < (int)uVar12 && (iVar10 == 1 && iVar11 == 3)) {
    uVar15 = _d * _elempack * _h * iVar2;
    pvVar13 = bottom_blob->data;
    sVar22 = bottom_blob->cstep;
    pvVar17 = top_blob->data;
    sVar5 = top_blob->cstep;
    sVar6 = top_blob->elemsize;
    sVar7 = bottom_blob->elemsize;
    uVar21 = 0;
    do {
      if (0 < (int)uVar15) {
        uVar23 = 0;
        do {
          *(float *)((long)pvVar17 + uVar23 * 4) = (float)(int)*(char *)((long)pvVar13 + uVar23);
          uVar23 = uVar23 + 1;
        } while (uVar15 != uVar23);
      }
      uVar21 = uVar21 + 1;
      pvVar17 = (void *)((long)pvVar17 + sVar5 * sVar6);
      pvVar13 = (void *)((long)pvVar13 + sVar22 * sVar7);
    } while (uVar21 != uVar12);
    iVar10 = (this->super_Cast).type_to;
  }
  if ((iVar11 == 1) && (iVar10 == 4)) {
    iVar11 = bottom_blob->c;
    if ((long)iVar11 < 1) {
      return 0;
    }
    uVar12 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar16 = 0;
    do {
      pauVar18 = (undefined1 (*) [16])
                 (bottom_blob->cstep * lVar16 * bottom_blob->elemsize + (long)bottom_blob->data);
      puVar20 = (undefined4 *)(top_blob->cstep * lVar16 * top_blob->elemsize + (long)top_blob->data)
      ;
      if ((int)uVar12 < 8) {
        uVar15 = 0;
      }
      else {
        iVar10 = 7;
        do {
          auVar25 = pshuflw(*pauVar18,*pauVar18,0xed);
          auVar25 = pshufhw(auVar25,auVar25,0xed);
          auVar26 = pshuflw(pauVar18[1],pauVar18[1],0xed);
          auVar26 = pshufhw(auVar26,auVar26,0xed);
          *puVar20 = auVar25._0_4_;
          puVar20[1] = auVar25._8_4_;
          puVar20[2] = auVar26._0_4_;
          puVar20[3] = auVar26._8_4_;
          pauVar18 = pauVar18 + 2;
          puVar20 = puVar20 + 4;
          iVar10 = iVar10 + 8;
          uVar15 = uVar12 & 0xfffffff8;
        } while (iVar10 < (int)uVar12);
      }
      if (uVar12 - uVar15 != 0 && (int)uVar15 <= (int)uVar12) {
        lVar14 = 0;
        do {
          *(undefined2 *)((long)puVar20 + lVar14 * 2) = *(undefined2 *)(*pauVar18 + lVar14 * 4 + 2);
          lVar14 = lVar14 + 1;
        } while (uVar12 - uVar15 != (int)lVar14);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != iVar11);
    iVar11 = (this->super_Cast).type_from;
    iVar10 = (this->super_Cast).type_to;
  }
  if (iVar11 == 4) {
    if (iVar10 != 1) {
      return 0;
    }
    iVar11 = bottom_blob->c;
    if (0 < (long)iVar11) {
      uVar12 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      lVar16 = 0;
      do {
        puVar19 = (undefined8 *)
                  (bottom_blob->cstep * lVar16 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar18 = (undefined1 (*) [16])
                   (top_blob->cstep * lVar16 * top_blob->elemsize + (long)top_blob->data);
        if ((int)uVar12 < 4) {
          uVar15 = 0;
        }
        else {
          iVar10 = 3;
          do {
            uVar1 = *puVar19;
            auVar8._10_2_ = (short)((ulong)uVar1 >> 0x20);
            auVar8._0_10_ = (unkuint10)0;
            auVar25._2_12_ =
                 SUB1612(ZEXT616(CONCAT42(auVar8._8_4_,(short)((ulong)uVar1 >> 0x10))) << 0x30,4);
            auVar25._0_2_ = (short)uVar1;
            auVar25._14_2_ = 0;
            *pauVar18 = auVar25 << 0x10;
            puVar19 = puVar19 + 1;
            pauVar18 = pauVar18 + 1;
            iVar10 = iVar10 + 4;
            uVar15 = uVar12 & 0xfffffffc;
          } while (iVar10 < (int)uVar12);
        }
        if (uVar12 - uVar15 != 0 && (int)uVar15 <= (int)uVar12) {
          lVar14 = 0;
          do {
            *(uint *)((long)*pauVar18 + lVar14 * 4) =
                 (uint)*(ushort *)((long)puVar19 + lVar14 * 2) << 0x10;
            lVar14 = lVar14 + 1;
          } while (uVar12 - uVar15 != (int)lVar14);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != iVar11);
      return 0;
    }
    return 0;
  }
  return 0;
}

Assistant:

int Cast_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}